

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestFilterTest.cpp
# Opt level: O2

void __thiscall
TEST_TestFilter_invertStrictMatching_TestShell::~TEST_TestFilter_invertStrictMatching_TestShell
          (TEST_TestFilter_invertStrictMatching_TestShell *this)

{
  ExecFunctionTestShell::~ExecFunctionTestShell((ExecFunctionTestShell *)this);
  operator_delete(this,0x38);
  return;
}

Assistant:

TEST(TestFilter, invertStrictMatching)
{
    TestFilter filter("filter");
    filter.invertMatching();
    filter.strictMatching();
    CHECK(!filter.match("filter"));
    CHECK(filter.match("filterr"));
    CHECK(filter.match(" filter"));
}